

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaValidatorPopElem(xmlSchemaValidCtxtPtr vctxt)

{
  int iVar1;
  uint uVar2;
  xmlSchemaNodeInfoPtr inode;
  xmlSchemaIDCPtr_conflict pxVar3;
  void **ppvVar4;
  long *plVar5;
  void *pvVar6;
  xmlSchemaPSVIIDCKeyPtr *ppxVar7;
  xmlSchemaPSVIIDCKeyPtr *ppxVar8;
  long lVar9;
  xmlSchemaPSVIIDCNodePtr pxVar10;
  xmlSchemaItemListPtr pxVar11;
  xmlDoc *doc;
  int iVar12;
  uint uVar13;
  xmlRegExecCtxtPtr exec;
  xmlSchemaPSVIIDCBindingPtr_conflict pxVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  xmlSchemaTypePtr pxVar17;
  xmlSchemaPSVIIDCBindingPtr_conflict pxVar18;
  xmlSchemaPSVIIDCNodePtr *ppxVar19;
  xmlSchemaItemListPtr pxVar20;
  xmlChar *pxVar21;
  xmlNodePtr cur;
  xmlSchemaIDCAugPtr_conflict aidc;
  xmlSchemaIDCAugPtr_conflict pxVar22;
  xmlSchemaContentType xVar23;
  char *pcVar24;
  xmlSchemaIDCMatcherPtr_conflict pxVar25;
  uint uVar26;
  xmlSchemaPSVIIDCBindingPtr_conflict pxVar27;
  xmlParserErrors error;
  uint uVar28;
  xmlChar **in_R8;
  xmlChar *in_R9;
  ulong uVar29;
  long lVar30;
  xmlSchemaPSVIIDCBindingPtr_conflict *ppxVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  bool bVar38;
  int terminal;
  int nbval;
  int nbneg;
  xmlChar *values [10];
  xmlChar *in_stack_fffffffffffffed8;
  xmlChar **in_stack_fffffffffffffee0;
  xmlSchemaPSVIIDCNodePtr local_108;
  xmlHashTablePtr local_100;
  void **local_e8;
  xmlSchemaPSVIIDCNodePtr *local_d0;
  xmlChar *local_c8;
  xmlChar *local_c0;
  xmlSchemaNodeInfoPtr local_b8;
  uint local_ac;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  xmlChar *local_88 [11];
  
  inode = vctxt->inode;
  if (vctxt->nbAttrInfos != 0) {
    xmlSchemaClearAttrInfos(vctxt);
  }
  uVar13 = inode->flags;
  if ((uVar13 >> 9 & 1) == 0) {
    pxVar17 = inode->typeDef;
    uVar37 = 0;
    if ((uVar13 >> 10 & 1) != 0 || pxVar17 == (xmlSchemaTypePtr)0x0) goto LAB_001a51a3;
    xVar23 = pxVar17->contentType;
    uVar37 = 0;
    if (((xVar23 & ~XML_SCHEMA_CONTENT_EMPTY) == XML_SCHEMA_CONTENT_ELEMENTS) &&
       (pxVar17->builtInType != 0x2d)) {
      uVar37 = 0;
      if ((uVar13 >> 8 & 1) != 0) {
LAB_001a60ff:
        if (xVar23 == XML_SCHEMA_CONTENT_ELEMENTS) goto LAB_001a51a3;
        goto LAB_001a6108;
      }
      local_c0 = (xmlChar *)CONCAT44(local_c0._4_4_,10);
      exec = inode->regexCtxt;
      if (exec != (xmlRegExecCtxtPtr)0x0) {
LAB_001a513a:
        uVar37 = 0;
        if ((uVar13 & 4) == 0) {
          in_R8 = &local_c8;
          xmlRegExecNextValues(exec,(int *)&local_c0,(int *)&local_ac,local_88,(int *)in_R8);
          uVar37 = 0;
          iVar12 = xmlRegExecPushString(inode->regexCtxt,(xmlChar *)0x0,(void *)0x0);
          if (iVar12 < 0) {
            uVar13 = inode->flags;
          }
          else if ((iVar12 != 0) || (uVar13 = inode->flags, (uVar13 & 4) != 0)) goto LAB_001a60f7;
          inode->flags = uVar13 | 0x100;
          in_R8 = local_88;
          xmlSchemaComplexTypeErr
                    ((xmlSchemaAbstractCtxtPtr)vctxt,0x1e4bd8,
                     (xmlNodePtr)((ulong)local_c0 & 0xffffffff),(xmlSchemaTypePtr)(ulong)local_ac,
                     (char *)in_R8,(int)in_R9,(int)in_stack_fffffffffffffed8,
                     in_stack_fffffffffffffee0);
          uVar37 = 1;
        }
LAB_001a60f7:
        xVar23 = inode->typeDef->contentType;
        goto LAB_001a60ff;
      }
      exec = xmlRegNewExecCtxt(pxVar17->contModel,xmlSchemaVContentModelCallback,vctxt);
      inode->regexCtxt = exec;
      if (exec != (xmlRegExecCtxtPtr)0x0) {
        uVar13 = inode->flags;
        goto LAB_001a513a;
      }
      pcVar24 = "failed to create a regex context";
    }
    else {
LAB_001a6108:
      if (vctxt->value != (xmlSchemaValPtr)0x0) {
        xmlSchemaFreeValue(vctxt->value);
        vctxt->value = (xmlSchemaValPtr)0x0;
      }
      if (inode->decl == (xmlSchemaElementPtr)0x0) {
        pxVar17 = inode->typeDef;
        if ((pxVar17->type != XML_SCHEMA_TYPE_SIMPLE) &&
           ((pxVar17->type != XML_SCHEMA_TYPE_BASIC || (pxVar17->builtInType == 0x2d)))) {
          if ((pxVar17->contentType | XML_SCHEMA_CONTENT_ELEMENTS) != XML_SCHEMA_CONTENT_BASIC)
          goto LAB_001a51a3;
          pxVar17 = pxVar17->contentTypeDef;
        }
        uVar13 = xmlSchemaVCheckINodeDataType(vctxt,inode,pxVar17,inode->value);
        uVar37 = (ulong)uVar13;
        bVar38 = (int)uVar13 < 0;
      }
      else {
        pxVar21 = inode->decl->value;
        uVar13 = inode->flags;
        if ((uVar13 & 0x24) == 0x20 && pxVar21 != (xmlChar *)0x0) {
          if ((uVar13 & 8) == 0) {
            pxVar17 = inode->typeDef;
            if ((pxVar17->type == XML_SCHEMA_TYPE_SIMPLE) ||
               ((pxVar17->type == XML_SCHEMA_TYPE_BASIC && (pxVar17->builtInType != 0x2d)))) {
LAB_001a618d:
              uVar13 = xmlSchemaVCheckINodeDataType(vctxt,inode,pxVar17,pxVar21);
              uVar37 = (ulong)uVar13;
            }
            else if ((pxVar17->contentType | XML_SCHEMA_CONTENT_ELEMENTS) ==
                     XML_SCHEMA_CONTENT_BASIC) {
              pxVar17 = pxVar17->contentTypeDef;
              goto LAB_001a618d;
            }
            bVar38 = (int)uVar37 < 0;
            if ((int)uVar37 != 0) goto LAB_001a6240;
          }
          else {
            uVar13 = xmlSchemaCheckCOSValidDefault(vctxt,pxVar21,&inode->val);
            if (uVar13 != 0) {
              uVar37 = (ulong)uVar13;
              if ((int)uVar13 < 0) {
                pcVar24 = "calling xmlSchemaCheckCOSValidDefault()";
                goto LAB_001a6254;
              }
              goto LAB_001a51a3;
            }
          }
          uVar37 = 0;
          if (((vctxt->options & 1) != 0) && (inode->node != (xmlNodePtr)0x0)) {
            pxVar21 = xmlSchemaNormalizeValue(inode->typeDef,inode->decl->value);
            doc = inode->node->doc;
            if (pxVar21 == (xmlChar *)0x0) {
              cur = xmlNewDocText(doc,inode->decl->value);
            }
            else {
              cur = xmlNewDocText(doc,pxVar21);
              (*xmlFree)(pxVar21);
            }
            if (cur == (xmlNodePtr)0x0) {
              pcVar24 = "calling xmlNewDocText()";
              goto LAB_001a6254;
            }
            xmlAddChild(inode->node,cur);
          }
          goto LAB_001a51a3;
        }
        if ((uVar13 & 4) != 0) goto LAB_001a51a3;
        pxVar17 = inode->typeDef;
        if ((pxVar17->type == XML_SCHEMA_TYPE_SIMPLE) ||
           ((pxVar17->type == XML_SCHEMA_TYPE_BASIC && (pxVar17->builtInType != 0x2d)))) {
LAB_001a6224:
          uVar13 = xmlSchemaVCheckINodeDataType(vctxt,inode,pxVar17,inode->value);
          uVar37 = (ulong)uVar13;
        }
        else if ((pxVar17->contentType | XML_SCHEMA_CONTENT_ELEMENTS) == XML_SCHEMA_CONTENT_BASIC) {
          pxVar17 = pxVar17->contentTypeDef;
          goto LAB_001a6224;
        }
        bVar38 = (int)uVar37 < 0;
        if ((int)uVar37 == 0) {
          pxVar21 = inode->decl->value;
          uVar37 = 0;
          if ((pxVar21 == (xmlChar *)0x0) || ((inode->decl->flags & 8) == 0)) goto LAB_001a51a3;
          if ((inode->flags & 0x80) == 0) {
            xVar23 = inode->typeDef->contentType;
            if ((xVar23 == XML_SCHEMA_CONTENT_BASIC) || (xVar23 == XML_SCHEMA_CONTENT_SIMPLE)) {
              iVar12 = xmlStrEqual(inode->value,pxVar21);
              if (iVar12 == 0) {
                in_R9 = inode->value;
                in_stack_fffffffffffffed8 = inode->decl->value;
                pcVar24 = "The actual value \'%s\' does not match the fixed value constraint \'%s\'"
                ;
                uVar37 = 0x742;
                error = XML_SCHEMAV_CVC_ELT_5_2_2_2_2;
                goto LAB_001a648a;
              }
            }
            else if ((xVar23 == XML_SCHEMA_CONTENT_MIXED) &&
                    (iVar12 = xmlStrEqual(inode->value,pxVar21), iVar12 == 0)) {
              in_R9 = inode->value;
              in_stack_fffffffffffffed8 = inode->decl->value;
              pcVar24 = "The initial value \'%s\' does not match the fixed value constraint \'%s\'";
              uVar37 = 0x741;
              error = XML_SCHEMAV_CVC_ELT_5_2_2_2_1;
              goto LAB_001a648a;
            }
          }
          else {
            in_stack_fffffffffffffed8 = (xmlChar *)0x0;
            pcVar24 = 
            "The content must not contain element nodes since there is a fixed value constraint";
            uVar37 = 0x740;
            error = XML_SCHEMAV_CVC_ELT_5_2_2_1;
            in_R9 = (xmlChar *)0x0;
LAB_001a648a:
            xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,error,(xmlNodePtr)0x0,
                                (xmlSchemaBasicItemPtr)0x0,pcVar24,in_R9,in_stack_fffffffffffffed8,
                                (xmlChar *)0x0,(xmlChar *)0x0);
          }
          goto LAB_001a51a3;
        }
      }
LAB_001a6240:
      if (!bVar38) goto LAB_001a51a3;
      pcVar24 = "calling xmlSchemaVCheckCVCSimpleType()";
    }
LAB_001a6254:
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidatorPopElem",pcVar24,(xmlChar *)0x0,
               (xmlChar *)in_R8);
LAB_001a625e:
    vctxt->err = -1;
    iVar12 = -1;
  }
  else {
    vctxt->skipDepth = vctxt->depth + -1;
    uVar37 = 0;
LAB_001a51a3:
    iVar12 = vctxt->depth;
    if (-1 < iVar12) {
      if (iVar12 == vctxt->skipDepth) {
        vctxt->skipDepth = -1;
      }
      local_b8 = inode;
      local_90 = uVar37;
      if ((inode->appliedXPath != 0) &&
         (iVar12 = xmlSchemaXPathProcessHistory(vctxt,iVar12), iVar12 == -1)) goto LAB_001a625e;
      pxVar25 = local_b8->idcMatchers;
      if ((pxVar25 != (xmlSchemaIDCMatcherPtr_conflict)0x0) &&
         ((vctxt->hasKeyrefs != 0 || (vctxt->createIDCNodeTables != 0)))) {
        do {
          pxVar3 = pxVar25->aidc->def;
          if ((pxVar3->type != XML_SCHEMA_TYPE_IDC_KEYREF) &&
             (((pxVar25->targets != (xmlSchemaItemListPtr)0x0 && (pxVar25->targets->nbItems != 0))
              && ((vctxt->createIDCNodeTables != 0 ||
                  ((iVar12 = pxVar25->aidc->keyrefDepth, iVar12 != -1 && (iVar12 <= vctxt->depth))))
                 )))) {
            pxVar27 = vctxt->elemInfos[pxVar25->depth]->idcTable;
            if (pxVar27 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
              pxVar18 = (xmlSchemaPSVIIDCBindingPtr_conflict)
                        &vctxt->elemInfos[pxVar25->depth]->idcTable;
            }
            else {
              do {
                pxVar14 = pxVar27;
                if (pxVar14->definition == pxVar3) goto LAB_001a52ac;
                pxVar27 = pxVar14->next;
                pxVar18 = pxVar14;
              } while (pxVar14->next != (xmlSchemaPSVIIDCBindingPtr)0x0);
            }
            pxVar14 = xmlSchemaIDCNewBinding(pxVar3);
            pxVar18->next = pxVar14;
            if (pxVar14 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) goto LAB_001a625e;
LAB_001a52ac:
            pxVar20 = pxVar14->dupls;
            if ((pxVar20 == (xmlSchemaItemListPtr)0x0) ||
               (uVar37 = (ulong)(uint)pxVar20->nbItems, pxVar20->nbItems == 0)) {
              uVar37 = 0;
              local_100 = (xmlHashTablePtr)0x0;
            }
            else {
              local_100 = (xmlHashTablePtr)pxVar20->items;
            }
            iVar12 = (int)uVar37;
            if (pxVar14->nodeTable == (xmlSchemaPSVIIDCNodePtr *)0x0) {
              if (iVar12 != 0) {
                bVar38 = false;
                goto LAB_001a5313;
              }
            }
            else {
              bVar38 = iVar12 == 0;
              if (pxVar14->nbNodes != 0 || iVar12 != 0) {
LAB_001a5313:
                uVar13 = pxVar25->targets->nbItems;
                ppvVar4 = pxVar25->targets->items;
                uVar32 = pxVar25->aidc->def->nbFields;
                if (iVar12 < 2) {
                  uVar37 = 1;
                }
                if ((int)uVar13 < 2) {
                  uVar13 = 1;
                }
                uVar36 = 0;
                do {
                  plVar5 = *(long **)((long)ppvVar4[uVar36] + 8);
                  if (!bVar38) {
                    uVar29 = 0;
                    do {
                      if (uVar32 == 1) {
                        iVar12 = xmlSchemaAreValuesEqual
                                           (*(xmlSchemaValPtr *)(*plVar5 + 8),
                                            *(xmlSchemaValPtr *)
                                             (**(long **)((long)*(void **)((long)local_100 +
                                                                          uVar29 * 8) + 8) + 8));
                        if (iVar12 == -1) goto LAB_001a625e;
                        if (iVar12 == 1) goto LAB_001a55b9;
                      }
                      else if (0 < (int)uVar32) {
                        lVar30 = *(long *)((long)*(void **)((long)local_100 + uVar29 * 8) + 8);
                        uVar34 = 0;
                        while( true ) {
                          iVar12 = xmlSchemaAreValuesEqual
                                             (*(xmlSchemaValPtr *)(plVar5[uVar34] + 8),
                                              *(xmlSchemaValPtr *)
                                               (*(long *)(lVar30 + uVar34 * 8) + 8));
                          if (iVar12 == -1) goto LAB_001a625e;
                          if (iVar12 == 0) break;
                          uVar34 = uVar34 + 1;
                          if (uVar32 == uVar34) goto LAB_001a55b9;
                        }
                      }
                      uVar29 = uVar29 + 1;
                    } while (uVar29 != uVar37);
                  }
                  if (pxVar14->nbNodes == 0) {
                    iVar12 = 0;
                  }
                  else {
                    uVar29 = 0;
                    do {
                      if (uVar32 == 1) {
                        iVar12 = xmlSchemaAreValuesEqual
                                           (*(xmlSchemaValPtr *)(*plVar5 + 8),
                                            (*pxVar14->nodeTable[uVar29]->keys)->val);
                        if (iVar12 == 0) goto LAB_001a53a4;
                        if (iVar12 == -1) goto LAB_001a625e;
LAB_001a53fc:
                        pxVar20 = pxVar14->dupls;
                        if (pxVar20 == (xmlSchemaItemListPtr)0x0) {
                          pxVar20 = xmlSchemaItemListCreate();
                          pxVar14->dupls = pxVar20;
                          if (pxVar20 == (xmlSchemaItemListPtr)0x0) goto LAB_001a625e;
                        }
                        iVar12 = xmlSchemaItemListAddSize
                                           (pxVar20,0x14,pxVar14->nodeTable[uVar29 & 0xffffffff]);
                        if (iVar12 == -1) goto LAB_001a625e;
                        local_100 = (xmlHashTablePtr)pxVar14->dupls->items;
                        iVar12 = pxVar14->nbNodes;
                        pxVar14->nodeTable[uVar29 & 0xffffffff] =
                             pxVar14->nodeTable[(long)iVar12 + -1];
                        pxVar14->nbNodes = iVar12 + -1;
                        goto LAB_001a55b9;
                      }
                      if ((int)uVar32 < 1) goto LAB_001a53fc;
                      ppxVar7 = pxVar14->nodeTable[uVar29]->keys;
                      uVar34 = 0;
                      while( true ) {
                        iVar12 = xmlSchemaAreValuesEqual
                                           (*(xmlSchemaValPtr *)(plVar5[uVar34] + 8),
                                            ppxVar7[uVar34]->val);
                        if (iVar12 == -1) goto LAB_001a625e;
                        if (iVar12 == 0) break;
                        uVar34 = uVar34 + 1;
                        if (uVar32 == uVar34) goto LAB_001a53fc;
                      }
LAB_001a53a4:
                      uVar29 = uVar29 + 1;
                      iVar12 = pxVar14->nbNodes;
                    } while ((long)uVar29 < (long)iVar12);
                  }
                  pxVar10 = (xmlSchemaPSVIIDCNodePtr)ppvVar4[uVar36];
                  uVar2 = pxVar14->sizeNodes;
                  if ((int)uVar2 <= iVar12) {
                    if ((int)uVar2 < 1) {
                      uVar29 = 10;
LAB_001a556f:
                      ppxVar19 = (xmlSchemaPSVIIDCNodePtr *)
                                 (*xmlRealloc)(pxVar14->nodeTable,uVar29 << 3);
                      if (ppxVar19 != (xmlSchemaPSVIIDCNodePtr *)0x0) {
                        pxVar14->nodeTable = ppxVar19;
                        pxVar14->sizeNodes = (int)uVar29;
                        iVar12 = pxVar14->nbNodes;
                        goto LAB_001a55ab;
                      }
                    }
                    else if (uVar2 < 1000000000) {
                      uVar26 = uVar2 + 1 >> 1;
                      uVar28 = uVar26 + uVar2;
                      if (1000000000 - uVar26 < uVar2) {
                        uVar28 = 1000000000;
                      }
                      uVar29 = (ulong)uVar28;
                      goto LAB_001a556f;
                    }
                    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,
                                        (void *)0x0,0x11,(xmlError *)0x0);
                    goto LAB_001a625e;
                  }
                  ppxVar19 = pxVar14->nodeTable;
LAB_001a55ab:
                  pxVar14->nbNodes = iVar12 + 1;
                  ppxVar19[iVar12] = pxVar10;
LAB_001a55b9:
                  uVar36 = uVar36 + 1;
                } while (uVar36 != uVar13);
                goto LAB_001a5617;
              }
              (*xmlFree)(pxVar14->nodeTable);
            }
            pxVar20 = pxVar25->targets;
            pxVar14->nodeTable = (xmlSchemaPSVIIDCNodePtr *)pxVar20->items;
            iVar12 = pxVar20->sizeItems;
            pxVar14->nbNodes = pxVar20->nbItems;
            pxVar14->sizeNodes = iVar12;
            pxVar20->items = (void **)0x0;
            pxVar20->nbItems = 0;
            pxVar20->sizeItems = 0;
            if (pxVar25->htab != (xmlHashTablePtr)0x0) {
              xmlHashFree(pxVar25->htab,xmlFreeIDCHashEntry);
              pxVar25->htab = (xmlHashTablePtr)0x0;
            }
          }
LAB_001a5617:
          pxVar25 = pxVar25->next;
        } while (pxVar25 != (xmlSchemaIDCMatcherPtr)0x0);
      }
      if (vctxt->inode->hasKeyrefs != 0) {
        for (pxVar25 = vctxt->inode->idcMatchers; pxVar25 != (xmlSchemaIDCMatcherPtr_conflict)0x0;
            pxVar25 = pxVar25->next) {
          if (((pxVar25->idcType == 0x18) && (pxVar25->targets != (xmlSchemaItemListPtr)0x0)) &&
             (pxVar25->targets->nbItems != 0)) {
            pxVar3 = pxVar25->aidc->def;
            uVar13 = pxVar3->nbFields;
            pxVar27 = (xmlSchemaPSVIIDCBindingPtr_conflict)&vctxt->inode->idcTable;
            do {
              pxVar27 = pxVar27->next;
              if (pxVar27 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
                bVar38 = false;
                local_100 = (xmlHashTablePtr)0x0;
                goto LAB_001a57be;
              }
            } while ((xmlSchemaIDCPtr_conflict)pxVar3->ref->item != pxVar27->definition);
            if (pxVar27->dupls == (xmlSchemaItemListPtr)0x0) {
              bVar38 = false;
            }
            else {
              bVar38 = pxVar27->dupls->nbItems != 0;
            }
            local_100 = xmlHashCreate(pxVar27->nbNodes * 2);
            if (0 < pxVar27->nbNodes) {
              lVar30 = 0;
              do {
                xmlSchemaFormatIDCKeySequence_1
                          (vctxt,local_88,pxVar27->nodeTable[lVar30]->keys,uVar13,1);
                puVar15 = (undefined8 *)(*xmlMalloc)(0x10);
                pxVar21 = local_88[0];
                if (puVar15 == (undefined8 *)0x0) {
                  xmlSchemaVErrMemory(vctxt);
                  pxVar21 = local_88[0];
                }
                else {
                  *(int *)(puVar15 + 1) = (int)lVar30;
                  puVar16 = (undefined8 *)xmlHashLookup(local_100,local_88[0]);
                  if (puVar16 == (undefined8 *)0x0) {
                    *puVar15 = 0;
                    iVar12 = xmlHashAddEntry(local_100,pxVar21,puVar15);
                    if (iVar12 < 0) {
                      xmlSchemaVErrMemory(vctxt);
                      (*xmlFree)(puVar15);
                    }
                  }
                  else {
                    *puVar15 = *puVar16;
                    *puVar16 = puVar15;
                  }
                }
                if (pxVar21 != (xmlChar *)0x0) {
                  (*xmlFree)(pxVar21);
                }
                lVar30 = lVar30 + 1;
              } while (lVar30 < pxVar27->nbNodes);
            }
LAB_001a57be:
            pxVar20 = pxVar25->targets;
            if (0 < pxVar20->nbItems) {
              lVar30 = 0;
              do {
                pvVar6 = pxVar20->items[lVar30];
                if (pxVar27 != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
                  ppxVar7 = *(xmlSchemaPSVIIDCKeyPtr **)((long)pvVar6 + 8);
                  xmlSchemaFormatIDCKeySequence_1(vctxt,local_88,ppxVar7,uVar13,1);
                  pxVar21 = local_88[0];
                  puVar15 = (undefined8 *)xmlHashLookup(local_100,local_88[0]);
                  if (pxVar21 != (xmlChar *)0x0) {
                    (*xmlFree)(pxVar21);
                    local_88[0] = (xmlChar *)0x0;
                  }
                  for (; puVar15 != (undefined8 *)0x0; puVar15 = (undefined8 *)*puVar15) {
                    if (0 < (int)uVar13) {
                      ppxVar8 = pxVar27->nodeTable[*(int *)(puVar15 + 1)]->keys;
                      uVar37 = 0;
                      while( true ) {
                        iVar12 = xmlSchemaAreValuesEqual(ppxVar8[uVar37]->val,ppxVar7[uVar37]->val);
                        if (iVar12 == -1) goto LAB_001a625e;
                        if (iVar12 == 0) break;
                        uVar37 = uVar37 + 1;
                        if (uVar13 == uVar37) goto LAB_001a5a2e;
                      }
                    }
                  }
                  if ((bVar38) && (pxVar20 = pxVar27->dupls, 0 < pxVar20->nbItems)) {
                    lVar35 = 0;
                    do {
                      if (0 < (int)uVar13) {
                        lVar9 = *(long *)((long)pxVar20->items[lVar35] + 8);
                        uVar37 = 0;
                        while( true ) {
                          iVar12 = xmlSchemaAreValuesEqual
                                             (*(xmlSchemaValPtr *)
                                               (*(long *)(lVar9 + uVar37 * 8) + 8),
                                              ppxVar7[uVar37]->val);
                          if (iVar12 == -1) goto LAB_001a625e;
                          if (iVar12 == 0) break;
                          uVar37 = uVar37 + 1;
                          if (uVar13 == uVar37) {
                            local_c8 = (xmlChar *)0x0;
                            local_c0 = (xmlChar *)0x0;
                            pxVar17 = (xmlSchemaTypePtr)
                                      xmlSchemaFormatIDCKeySequence_1
                                                (vctxt,&local_c8,
                                                 *(xmlSchemaPSVIIDCKeyPtr **)((long)pvVar6 + 8),
                                                 uVar13,0);
                            pxVar21 = xmlSchemaGetComponentQName(&local_c0,pxVar25->aidc->def);
                            xmlSchemaKeyrefErr(vctxt,(xmlParserErrors)pvVar6,
                                               (xmlSchemaPSVIIDCNodePtr)
                                               "More than one match found for key-sequence %s of keyref \'%s\'"
                                               ,pxVar17,(char *)pxVar21,in_R9,
                                               in_stack_fffffffffffffed8);
                            if (local_c8 != (xmlChar *)0x0) {
                              (*xmlFree)(local_c8);
                            }
                            if (local_c0 != (xmlChar *)0x0) {
                              (*xmlFree)(local_c0);
                            }
                            goto LAB_001a5a2e;
                          }
                        }
                        pxVar20 = pxVar27->dupls;
                      }
                      lVar35 = lVar35 + 1;
                    } while (lVar35 < pxVar20->nbItems);
                  }
                }
                local_88[0] = (xmlChar *)0x0;
                local_c8 = (xmlChar *)0x0;
                pxVar17 = (xmlSchemaTypePtr)
                          xmlSchemaFormatIDCKeySequence_1
                                    (vctxt,local_88,*(xmlSchemaPSVIIDCKeyPtr **)((long)pvVar6 + 8),
                                     uVar13,0);
                pxVar21 = xmlSchemaGetComponentQName(&local_c8,pxVar25->aidc->def);
                xmlSchemaKeyrefErr(vctxt,(xmlParserErrors)pvVar6,
                                   (xmlSchemaPSVIIDCNodePtr)
                                   "No match found for key-sequence %s of keyref \'%s\'",pxVar17,
                                   (char *)pxVar21,in_R9,in_stack_fffffffffffffed8);
                if (local_88[0] != (xmlChar *)0x0) {
                  (*xmlFree)(local_88[0]);
                }
                if (local_c8 != (xmlChar *)0x0) {
                  (*xmlFree)(local_c8);
                }
LAB_001a5a2e:
                lVar30 = lVar30 + 1;
                pxVar20 = pxVar25->targets;
              } while (lVar30 < pxVar20->nbItems);
            }
            if (local_100 != (xmlHashTablePtr)0x0) {
              xmlHashFree(local_100,xmlFreeIDCHashEntry);
            }
          }
        }
      }
      if ((((local_b8->idcTable != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) &&
           (0 < (long)vctxt->depth)) &&
          ((vctxt->hasKeyrefs != 0 || (vctxt->createIDCNodeTables != 0)))) &&
         (pxVar27 = vctxt->inode->idcTable, pxVar27 != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0)) {
        ppxVar31 = &vctxt->elemInfos[(long)vctxt->depth + -1]->idcTable;
        iVar12 = 0;
        local_108 = (xmlSchemaPSVIIDCNodePtr)0x0;
        do {
          if ((pxVar27->nbNodes != 0) ||
             ((pxVar27->dupls != (xmlSchemaItemListPtr)0x0 && (pxVar27->dupls->nbItems != 0)))) {
            pxVar18 = (xmlSchemaPSVIIDCBindingPtr_conflict)ppxVar31;
            if (vctxt->createIDCNodeTables == 0) {
              pxVar22 = vctxt->aidcs;
              do {
                if (pxVar22->def == pxVar27->definition) {
                  if ((pxVar22->keyrefDepth == -1) || (vctxt->depth <= pxVar22->keyrefDepth))
                  goto LAB_001a6032;
                  break;
                }
                pxVar22 = pxVar22->next;
              } while (pxVar22 != (xmlSchemaIDCAugPtr)0x0);
            }
            do {
              pxVar18 = pxVar18->next;
              if (pxVar18 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
                pxVar18 = xmlSchemaIDCNewBinding(pxVar27->definition);
                if (pxVar18 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) goto LAB_001a625e;
                iVar1 = pxVar27->nbNodes;
                if ((long)iVar1 != 0) {
                  if (vctxt->psviExposeIDCNodeTables == 0) {
                    pxVar18->nodeTable = pxVar27->nodeTable;
                    pxVar27->nodeTable = (xmlSchemaPSVIIDCNodePtr *)0x0;
                    pxVar18->sizeNodes = pxVar27->sizeNodes;
                    pxVar27->sizeNodes = 0;
                    pxVar18->nbNodes = iVar1;
                    pxVar27->nbNodes = 0;
                  }
                  else {
                    ppxVar19 = (xmlSchemaPSVIIDCNodePtr *)(*xmlMalloc)((long)iVar1 << 3);
                    pxVar18->nodeTable = ppxVar19;
                    if (ppxVar19 == (xmlSchemaPSVIIDCNodePtr *)0x0) {
                      xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,
                                          (void *)0x0,0x11,(xmlError *)0x0);
                      xmlSchemaIDCFreeBinding(pxVar18);
                      goto LAB_001a625e;
                    }
                    iVar1 = pxVar27->nbNodes;
                    pxVar18->sizeNodes = iVar1;
                    pxVar18->nbNodes = iVar1;
                    memcpy(ppxVar19,pxVar27->nodeTable,(long)iVar1 << 3);
                  }
                }
                pxVar20 = pxVar27->dupls;
                if (pxVar20 != (xmlSchemaItemListPtr)0x0) {
                  pxVar11 = pxVar18->dupls;
                  if (pxVar11 != (xmlSchemaItemListPtr)0x0) {
                    if (pxVar11->items != (void **)0x0) {
                      (*xmlFree)(pxVar11->items);
                    }
                    (*xmlFree)(pxVar11);
                    pxVar20 = pxVar27->dupls;
                  }
                  pxVar18->dupls = pxVar20;
                  pxVar27->dupls = (xmlSchemaItemListPtr)0x0;
                }
                if (*ppxVar31 != (xmlSchemaPSVIIDCBindingPtr)0x0) {
                  pxVar18->next = *ppxVar31;
                }
                *ppxVar31 = pxVar18;
                goto LAB_001a6032;
              }
            } while (pxVar18->definition != pxVar27->definition);
            pxVar20 = pxVar18->dupls;
            if ((pxVar20 == (xmlSchemaItemListPtr)0x0) || (uVar13 = pxVar20->nbItems, uVar13 == 0))
            {
              local_e8 = (void **)0x0;
              uVar13 = 0;
            }
            else {
              local_e8 = pxVar20->items;
            }
            if (0 < pxVar27->nbNodes) {
              uVar32 = pxVar18->nbNodes;
              uVar2 = pxVar27->definition->nbFields;
              local_d0 = pxVar18->nodeTable;
              local_a8 = (ulong)(int)uVar13;
              local_a0 = (ulong)(uVar13 - 1);
              lVar30 = 0;
LAB_001a5c39:
              uVar37 = local_a8;
              pxVar10 = pxVar27->nodeTable[lVar30];
              if (pxVar10 != (xmlSchemaPSVIIDCNodePtr)0x0) {
                if (uVar13 != 0) {
                  if ((int)uVar13 < 1) {
                    uVar37 = 0;
                  }
                  else if (uVar2 == 1) {
                    uVar36 = 0;
                    while (iVar12 = xmlSchemaAreValuesEqual
                                              ((*pxVar10->keys)->val,
                                               *(xmlSchemaValPtr *)
                                                (**(long **)((long)local_e8[uVar36] + 8) + 8)),
                          iVar12 == 0) {
                      uVar36 = uVar36 + 1;
                      if ((long)uVar37 <= (long)uVar36) goto code_r0x001a5c9e;
                    }
                    uVar37 = uVar36;
                    if (iVar12 == -1) goto LAB_001a625e;
LAB_001a5d53:
                    iVar12 = 1;
                  }
                  else {
                    uVar37 = 0;
                    while( true ) {
                      local_108 = (xmlSchemaPSVIIDCNodePtr)local_e8[uVar37];
                      if ((int)uVar2 < 1) {
                        if (iVar12 == 1) {
                          iVar12 = 1;
                          goto LAB_001a5d62;
                        }
                      }
                      else {
                        uVar36 = 0;
                        while( true ) {
                          iVar12 = xmlSchemaAreValuesEqual
                                             (pxVar10->keys[uVar36]->val,
                                              local_108->keys[uVar36]->val);
                          if (iVar12 == -1) goto LAB_001a625e;
                          if (iVar12 == 0) break;
                          uVar36 = uVar36 + 1;
                          if (uVar2 == uVar36) goto LAB_001a5d53;
                        }
                        iVar12 = 0;
                      }
                      if (uVar37 == local_a0) break;
                      uVar37 = uVar37 + 1;
                    }
                    uVar37 = (ulong)uVar13;
                  }
                  goto LAB_001a5d62;
                }
                if (uVar32 == 0) {
                  uVar32 = 0;
                  goto LAB_001a5f99;
                }
                goto LAB_001a5d7d;
              }
              goto LAB_001a5f99;
            }
          }
LAB_001a6032:
          pxVar27 = pxVar27->next;
        } while (pxVar27 != (xmlSchemaPSVIIDCBindingPtr)0x0);
      }
      xmlSchemaClearElemInfo(vctxt,local_b8);
      iVar12 = vctxt->depth;
      if ((long)iVar12 != 0) {
        for (pxVar22 = vctxt->aidcs; pxVar22 != (xmlSchemaIDCAugPtr_conflict)0x0;
            pxVar22 = pxVar22->next) {
          if (pxVar22->keyrefDepth == iVar12) {
            pxVar22->keyrefDepth = -1;
          }
        }
        vctxt->depth = iVar12 + -1;
        vctxt->inode = vctxt->elemInfos[(long)iVar12 + -1];
        return (int)local_90;
      }
      vctxt->depth = -1;
      vctxt->inode = (xmlSchemaNodeInfoPtr)0x0;
    }
    iVar12 = 0;
  }
  return iVar12;
code_r0x001a5c9e:
  iVar12 = 0;
LAB_001a5d62:
  if (((uint)uVar37 == uVar13) && (uVar32 != 0)) {
LAB_001a5d7d:
    if ((int)uVar32 < 1) {
      uVar37 = 0;
LAB_001a5e5e:
      uVar28 = pxVar18->nbNodes;
      if ((uint)uVar37 != uVar32) {
        pxVar18->nbNodes = uVar28 - 1;
        local_d0[(int)(uint)uVar37] = local_d0[(long)(int)uVar32 + -1];
        if (uVar28 != uVar32) {
          local_d0[(long)(int)uVar32 + -1] = local_d0[(long)(int)uVar28 + -1];
        }
        pxVar20 = pxVar18->dupls;
        if (pxVar20 == (xmlSchemaItemListPtr)0x0) {
          pxVar20 = xmlSchemaItemListCreate();
          pxVar18->dupls = pxVar20;
          if (pxVar20 == (xmlSchemaItemListPtr)0x0) goto LAB_001a625e;
        }
        uVar32 = uVar32 - 1;
        xmlSchemaItemListAddSize(pxVar20,0x14,local_108);
        local_e8 = pxVar18->dupls->items;
        goto LAB_001a5f99;
      }
    }
    else {
      local_98 = (ulong)uVar32;
      uVar37 = 0;
      do {
        local_108 = local_d0[uVar37];
        if (uVar2 == 1) {
          iVar12 = xmlSchemaAreValuesEqual((*pxVar10->keys)->val,(*local_108->keys)->val);
          if (iVar12 != 0) {
            if (iVar12 == -1) goto LAB_001a625e;
LAB_001a5e54:
            iVar12 = 1;
            goto LAB_001a5e5e;
          }
        }
        else if ((int)uVar2 < 1) {
          if (iVar12 == 1) goto LAB_001a5e54;
        }
        else {
          uVar36 = 0;
          while( true ) {
            iVar12 = xmlSchemaAreValuesEqual
                               (pxVar10->keys[uVar36]->val,local_108->keys[uVar36]->val);
            if (iVar12 == -1) goto LAB_001a625e;
            if (iVar12 == 0) break;
            uVar36 = uVar36 + 1;
            if (uVar2 == uVar36) goto LAB_001a5e54;
          }
        }
        uVar37 = uVar37 + 1;
      } while (uVar37 != local_98);
      uVar28 = pxVar18->nbNodes;
    }
    uVar26 = pxVar18->sizeNodes;
    if ((int)uVar28 < (int)uVar26) {
      local_d0 = pxVar18->nodeTable;
    }
    else {
      if ((int)uVar26 < 1) {
        uVar37 = 10;
      }
      else {
        if (999999999 < uVar26) goto LAB_001a64b4;
        uVar33 = uVar26 + 1 >> 1;
        uVar28 = uVar33 + uVar26;
        if (1000000000 - uVar33 < uVar26) {
          uVar28 = 1000000000;
        }
        uVar37 = (ulong)uVar28;
      }
      local_d0 = (xmlSchemaPSVIIDCNodePtr *)(*xmlRealloc)(pxVar18->nodeTable,uVar37 << 3);
      if (local_d0 == (xmlSchemaPSVIIDCNodePtr *)0x0) {
LAB_001a64b4:
        xmlSchemaVErrMemory(vctxt);
        goto LAB_001a625e;
      }
      pxVar18->nodeTable = local_d0;
      pxVar18->sizeNodes = (int)uVar37;
      uVar28 = pxVar18->nbNodes;
    }
    pxVar18->nbNodes = uVar28 + 1;
    local_d0[(int)uVar28] = pxVar10;
  }
LAB_001a5f99:
  lVar30 = lVar30 + 1;
  if (pxVar27->nbNodes <= lVar30) goto LAB_001a6032;
  goto LAB_001a5c39;
}

Assistant:

static int
xmlSchemaValidatorPopElem(xmlSchemaValidCtxtPtr vctxt)
{
    int ret = 0;
    xmlSchemaNodeInfoPtr inode = vctxt->inode;

    if (vctxt->nbAttrInfos != 0)
	xmlSchemaClearAttrInfos(vctxt);
    if (inode->flags & XML_SCHEMA_NODE_INFO_ERR_NOT_EXPECTED) {
	/*
	* This element was not expected;
	* we will not validate child elements of broken parents.
	* Skip validation of all content of the parent.
	*/
	vctxt->skipDepth = vctxt->depth -1;
	goto end_elem;
    }
    if ((inode->typeDef == NULL) ||
	(inode->flags & XML_SCHEMA_NODE_INFO_ERR_BAD_TYPE)) {
	/*
	* 1. the type definition might be missing if the element was
	*    error prone
	* 2. it might be abstract.
	*/
	goto end_elem;
    }
    /*
    * Check the content model.
    */
    if ((inode->typeDef->contentType == XML_SCHEMA_CONTENT_MIXED) ||
	(inode->typeDef->contentType == XML_SCHEMA_CONTENT_ELEMENTS)) {

	/*
	* Workaround for "anyType".
	*/
	if (inode->typeDef->builtInType == XML_SCHEMAS_ANYTYPE)
	    goto character_content;

	if ((inode->flags & XML_SCHEMA_ELEM_INFO_ERR_BAD_CONTENT) == 0) {
	    xmlChar *values[10];
	    int terminal, nbval = 10, nbneg;

	    if (inode->regexCtxt == NULL) {
		/*
		* Create the regex context.
		*/
		inode->regexCtxt =
		    xmlRegNewExecCtxt(inode->typeDef->contModel,
		    xmlSchemaVContentModelCallback, vctxt);
		if (inode->regexCtxt == NULL) {
		    VERROR_INT("xmlSchemaValidatorPopElem",
			"failed to create a regex context");
		    goto internal_error;
		}
	    }

	    /*
	     * Do not check further content if the node has been nilled
	     */
	    if (INODE_NILLED(inode)) {
		ret = 0;
                goto skip_nilled;
	    }

	    /*
	    * Get hold of the still expected content, since a further
	    * call to xmlRegExecPushString() will lose this information.
	    */
	    xmlRegExecNextValues(inode->regexCtxt,
		&nbval, &nbneg, &values[0], &terminal);
	    ret = xmlRegExecPushString(inode->regexCtxt, NULL, NULL);
	    if ((ret<0) || ((ret==0) && (!INODE_NILLED(inode)))) {
		/*
		* Still missing something.
		*/
		ret = 1;
		inode->flags |=
		    XML_SCHEMA_ELEM_INFO_ERR_BAD_CONTENT;
		xmlSchemaComplexTypeErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_ELEMENT_CONTENT, NULL, NULL,
		    "Missing child element(s)",
		    nbval, nbneg, values);
	    } else {
		/*
		* Content model is satisfied.
		*/
		ret = 0;
	    }

	}
    }

skip_nilled:

    if (inode->typeDef->contentType == XML_SCHEMA_CONTENT_ELEMENTS)
	goto end_elem;

character_content:

    if (vctxt->value != NULL) {
	xmlSchemaFreeValue(vctxt->value);
	vctxt->value = NULL;
    }
    /*
    * Check character content.
    */
    if (inode->decl == NULL) {
	/*
	* Speedup if no declaration exists.
	*/
	if (WXS_IS_SIMPLE(inode->typeDef)) {
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef, inode->value);
	} else if (WXS_HAS_SIMPLE_CONTENT(inode->typeDef)) {
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef->contentTypeDef,
		inode->value);
	}
	if (ret < 0) {
	    VERROR_INT("xmlSchemaValidatorPopElem",
		"calling xmlSchemaVCheckCVCSimpleType()");
	    goto internal_error;
	}
	goto end_elem;
    }
    /*
    * cvc-elt (3.3.4) : 5
    * The appropriate case among the following must be true:
    */
    /*
    * cvc-elt (3.3.4) : 5.1
    * If the declaration has a {value constraint},
    * the item has neither element nor character [children] and
    * clause 3.2 has not applied, then all of the following must be true:
    */
    if ((inode->decl->value != NULL) &&
	(inode->flags & XML_SCHEMA_ELEM_INFO_EMPTY) &&
	(! INODE_NILLED(inode))) {
	/*
	* cvc-elt (3.3.4) : 5.1.1
	* If the `actual type definition` is a `local type definition`
	* then the canonical lexical representation of the {value constraint}
	* value must be a valid default for the `actual type definition` as
	* defined in Element Default Valid (Immediate) ($3.3.6).
	*/
	/*
	* NOTE: 'local' above means types acquired by xsi:type.
	* NOTE: Although the *canonical* value is stated, it is not
	* relevant if canonical or not. Additionally XML Schema 1.1
	* will removed this requirement as well.
	*/
	if (inode->flags & XML_SCHEMA_ELEM_INFO_LOCAL_TYPE) {

	    ret = xmlSchemaCheckCOSValidDefault(vctxt,
		inode->decl->value, &(inode->val));
	    if (ret != 0) {
		if (ret < 0) {
		    VERROR_INT("xmlSchemaValidatorPopElem",
			"calling xmlSchemaCheckCOSValidDefault()");
		    goto internal_error;
		}
		goto end_elem;
	    }
	    /*
	    * Stop here, to avoid redundant validation of the value
	    * (see following).
	    */
	    goto default_psvi;
	}
	/*
	* cvc-elt (3.3.4) : 5.1.2
	* The element information item with the canonical lexical
	* representation of the {value constraint} value used as its
	* `normalized value` must be `valid` with respect to the
	* `actual type definition` as defined by Element Locally Valid (Type)
	* ($3.3.4).
	*/
	if (WXS_IS_SIMPLE(inode->typeDef)) {
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef, inode->decl->value);
	} else if (WXS_HAS_SIMPLE_CONTENT(inode->typeDef)) {
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef->contentTypeDef,
		inode->decl->value);
	}
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidatorPopElem",
		    "calling xmlSchemaVCheckCVCSimpleType()");
		goto internal_error;
	    }
	    goto end_elem;
	}

default_psvi:
	/*
	* PSVI: Create a text node on the instance element.
	*/
	if ((vctxt->options & XML_SCHEMA_VAL_VC_I_CREATE) &&
	    (inode->node != NULL)) {
	    xmlNodePtr textChild;
	    xmlChar *normValue;
	    /*
	    * VAL TODO: Normalize the value.
	    */
	    normValue = xmlSchemaNormalizeValue(inode->typeDef,
		inode->decl->value);
	    if (normValue != NULL) {
		textChild = xmlNewDocText(inode->node->doc,
                        BAD_CAST normValue);
		xmlFree(normValue);
	    } else
		textChild = xmlNewDocText(inode->node->doc,
                        inode->decl->value);
	    if (textChild == NULL) {
		VERROR_INT("xmlSchemaValidatorPopElem",
		    "calling xmlNewDocText()");
		goto internal_error;
	    } else
		xmlAddChild(inode->node, textChild);
	}

    } else if (! INODE_NILLED(inode)) {
	/*
	* 5.2.1 The element information item must be `valid` with respect
	* to the `actual type definition` as defined by Element Locally
	* Valid (Type) ($3.3.4).
	*/
	if (WXS_IS_SIMPLE(inode->typeDef)) {
	     /*
	    * SPEC (cvc-type) (3.1)
	    * "If the type definition is a simple type definition, ..."
	    * (3.1.3) "If clause 3.2 of Element Locally Valid
	    * (Element) ($3.3.4) did not apply, then the `normalized value`
	    * must be `valid` with respect to the type definition as defined
	    * by String Valid ($3.14.4).
	    */
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		    inode, inode->typeDef, inode->value);
	} else if (WXS_HAS_SIMPLE_CONTENT(inode->typeDef)) {
	    /*
	    * SPEC (cvc-type) (3.2) "If the type definition is a complex type
	    * definition, then the element information item must be
	    * `valid` with respect to the type definition as per
	    * Element Locally Valid (Complex Type) ($3.4.4);"
	    *
	    * SPEC (cvc-complex-type) (2.2)
	    * "If the {content type} is a simple type definition, ...
	    * the `normalized value` of the element information item is
	    * `valid` with respect to that simple type definition as
	    * defined by String Valid ($3.14.4)."
	    */
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef->contentTypeDef, inode->value);
	}
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidatorPopElem",
		    "calling xmlSchemaVCheckCVCSimpleType()");
		goto internal_error;
	    }
	    goto end_elem;
	}
	/*
	* 5.2.2 If there is a fixed {value constraint} and clause 3.2 has
	* not applied, all of the following must be true:
	*/
	if ((inode->decl->value != NULL) &&
	    (inode->decl->flags & XML_SCHEMAS_ELEM_FIXED)) {

	    /*
	    * TODO: We will need a computed value, when comparison is
	    * done on computed values.
	    */
	    /*
	    * 5.2.2.1 The element information item must have no element
	    * information item [children].
	    */
	    if (inode->flags &
		    XML_SCHEMA_ELEM_INFO_HAS_ELEM_CONTENT) {
		ret = XML_SCHEMAV_CVC_ELT_5_2_2_1;
		VERROR(ret, NULL,
		    "The content must not contain element nodes since "
		    "there is a fixed value constraint");
		goto end_elem;
	    } else {
		/*
		* 5.2.2.2 The appropriate case among the following must
		* be true:
		*/
		if (WXS_HAS_MIXED_CONTENT(inode->typeDef)) {
		    /*
		    * 5.2.2.2.1 If the {content type} of the `actual type
		    * definition` is mixed, then the *initial value* of the
		    * item must match the canonical lexical representation
		    * of the {value constraint} value.
		    *
		    * ... the *initial value* of an element information
		    * item is the string composed of, in order, the
		    * [character code] of each character information item in
		    * the [children] of that element information item.
		    */
		    if (! xmlStrEqual(inode->value, inode->decl->value)){
			/*
			* VAL TODO: Report invalid & expected values as well.
			* VAL TODO: Implement the canonical stuff.
			*/
			ret = XML_SCHEMAV_CVC_ELT_5_2_2_2_1;
			xmlSchemaCustomErr(ACTXT_CAST vctxt,
			    ret, NULL, NULL,
			    "The initial value '%s' does not match the fixed "
			    "value constraint '%s'",
			    inode->value, inode->decl->value);
			goto end_elem;
		    }
		} else if (WXS_HAS_SIMPLE_CONTENT(inode->typeDef)) {
		    /*
		    * 5.2.2.2.2 If the {content type} of the `actual type
		    * definition` is a simple type definition, then the
		    * *actual value* of the item must match the canonical
		    * lexical representation of the {value constraint} value.
		    */
		    /*
		    * VAL TODO: *actual value* is the normalized value, impl.
		    *           this.
		    * VAL TODO: Report invalid & expected values as well.
		    * VAL TODO: Implement a comparison with the computed values.
		    */
		    if (! xmlStrEqual(inode->value,
			    inode->decl->value)) {
			ret = XML_SCHEMAV_CVC_ELT_5_2_2_2_2;
			xmlSchemaCustomErr(ACTXT_CAST vctxt,
			    ret, NULL, NULL,
			    "The actual value '%s' does not match the fixed "
			    "value constraint '%s'",
			    inode->value,
			    inode->decl->value);
			goto end_elem;
		    }
		}
	    }
	}
    }

end_elem:
    if (vctxt->depth < 0) {
	/* TODO: raise error? */
	return (0);
    }
    if (vctxt->depth == vctxt->skipDepth)
	vctxt->skipDepth = -1;
    /*
    * Evaluate the history of XPath state objects.
    */
    if (inode->appliedXPath &&
	(xmlSchemaXPathProcessHistory(vctxt, vctxt->depth) == -1))
	goto internal_error;
    /*
    * MAYBE TODO:
    * SPEC (6) "The element information item must be `valid` with
    * respect to each of the {identity-constraint definitions} as per
    * Identity-constraint Satisfied ($3.11.4)."
    */
    /*
    * PSVI TODO: If we expose IDC node-tables via PSVI then the tables
    *   need to be built in any case.
    *   We will currently build IDC node-tables and bubble them only if
    *   keyrefs do exist.
    */

    /*
    * Add the current IDC target-nodes to the IDC node-tables.
    */
    if ((inode->idcMatchers != NULL) &&
	(vctxt->hasKeyrefs || vctxt->createIDCNodeTables))
    {
	if (xmlSchemaIDCFillNodeTables(vctxt, inode) == -1)
	    goto internal_error;
    }
    /*
    * Validate IDC keyrefs.
    */
    if (vctxt->inode->hasKeyrefs)
	if (xmlSchemaCheckCVCIDCKeyRef(vctxt) == -1)
	    goto internal_error;
    /*
    * Merge/free the IDC table.
    */
    if (inode->idcTable != NULL) {
	if ((vctxt->depth > 0) &&
	    (vctxt->hasKeyrefs || vctxt->createIDCNodeTables))
	{
	    /*
	    * Merge the IDC node table with the table of the parent node.
	    */
	    if (xmlSchemaBubbleIDCNodeTables(vctxt) == -1)
		goto internal_error;
	}
    }
    /*
    * Clear the current ielem.
    * VAL TODO: Don't free the PSVI IDC tables if they are
    * requested for the PSVI.
    */
    xmlSchemaClearElemInfo(vctxt, inode);
    /*
    * Skip further processing if we are on the validation root.
    */
    if (vctxt->depth == 0) {
	vctxt->depth--;
	vctxt->inode = NULL;
	return (0);
    }
    /*
    * Reset the keyrefDepth if needed.
    */
    if (vctxt->aidcs != NULL) {
	xmlSchemaIDCAugPtr aidc = vctxt->aidcs;
	do {
	    if (aidc->keyrefDepth == vctxt->depth) {
		/*
		* A 'keyrefDepth' of a key/unique IDC matches the current
		* depth, this means that we are leaving the scope of the
		* top-most keyref IDC which refers to this IDC.
		*/
		aidc->keyrefDepth = -1;
	    }
	    aidc = aidc->next;
	} while (aidc != NULL);
    }
    vctxt->depth--;
    vctxt->inode = vctxt->elemInfos[vctxt->depth];
    /*
    * VAL TODO: 7 If the element information item is the `validation root`, it must be
    * `valid` per Validation Root Valid (ID/IDREF) ($3.3.4).
    */
    return (ret);

internal_error:
    vctxt->err = -1;
    return (-1);
}